

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_barriers.cpp
# Opt level: O3

spv_result_t spvtools::val::BarriersPass(ValidationState_t *_,Instruction *inst)

{
  size_t *psVar1;
  ushort uVar2;
  pointer puVar3;
  bool bVar4;
  spv_result_t sVar5;
  uint32_t uVar6;
  Op OVar7;
  Function *pFVar8;
  _Node *p_Var9;
  DiagnosticStream *pDVar10;
  uint32_t operand_index;
  long lVar11;
  char *pcVar12;
  char *local_230;
  _Any_data local_228;
  code *local_218;
  code *local_210;
  DiagnosticStream local_208;
  
  uVar2 = (inst->inst_).opcode;
  if (uVar2 < 0x148) {
    if (uVar2 == 0xe0) {
      if (_->version_ < 0x10300) {
        pFVar8 = ValidationState_t::function(_,inst->function_->id_);
        local_228._M_unused._M_object = (void *)0x0;
        local_228._8_8_ = 0;
        local_210 = std::
                    _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_barriers.cpp:40:17)>
                    ::_M_invoke;
        local_218 = std::
                    _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_barriers.cpp:40:17)>
                    ::_M_manager;
        p_Var9 = std::__cxx11::
                 list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
                 ::
                 _M_create_node<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>const&>
                           ((list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
                             *)&pFVar8->execution_model_limitations_,
                            (function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                             *)&local_228);
        std::__detail::_List_node_base::_M_hook(&p_Var9->super__List_node_base);
        psVar1 = &(pFVar8->execution_model_limitations_).
                  super__List_base<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
                  ._M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
        if (local_218 != (code *)0x0) {
          (*local_218)(&local_228,&local_228,__destroy_functor);
        }
      }
      puVar3 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar6 = puVar3[2];
      sVar5 = ValidateExecutionScope(_,inst,puVar3[1]);
      if (sVar5 != SPV_SUCCESS) {
        return sVar5;
      }
LAB_005f34af:
      sVar5 = ValidateMemoryScope(_,inst,uVar6);
      if (sVar5 != SPV_SUCCESS) {
        return sVar5;
      }
      operand_index = 2;
    }
    else {
      if (uVar2 != 0xe1) goto LAB_005f352c;
      uVar6 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_start[1];
      sVar5 = ValidateMemoryScope(_,inst,uVar6);
      if (sVar5 != SPV_SUCCESS) {
        return sVar5;
      }
      operand_index = 1;
    }
    sVar5 = ValidateMemorySemantics(_,inst,operand_index,uVar6);
    if (sVar5 != SPV_SUCCESS) {
      return sVar5;
    }
LAB_005f352c:
    sVar5 = SPV_SUCCESS;
  }
  else {
    if (uVar2 == 0x148) {
      OVar7 = ValidationState_t::GetIdOpcode(_,(inst->inst_).type_id);
      if (OVar7 == OpTypeNamedBarrier) {
        uVar6 = ValidationState_t::GetOperandTypeId(_,inst,2);
        bVar4 = ValidationState_t::IsIntScalarType(_,uVar6);
        if ((bVar4) && (uVar6 = ValidationState_t::GetBitWidth(_,uVar6), uVar6 == 0x20))
        goto LAB_005f352c;
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
        local_230 = spvOpcodeString(OpNamedBarrierInitialize);
        pDVar10 = DiagnosticStream::operator<<(&local_208,&local_230);
        pcVar12 = ": expected Subgroup Count to be a 32-bit int";
        lVar11 = 0x2c;
      }
      else {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
        local_230 = spvOpcodeString(OpNamedBarrierInitialize);
        pDVar10 = DiagnosticStream::operator<<(&local_208,&local_230);
        pcVar12 = ": expected Result Type to be OpTypeNamedBarrier";
        lVar11 = 0x2f;
      }
    }
    else {
      if (uVar2 != 0x149) goto LAB_005f352c;
      uVar6 = ValidationState_t::GetOperandTypeId(_,inst,0);
      OVar7 = ValidationState_t::GetIdOpcode(_,uVar6);
      if (OVar7 == OpTypeNamedBarrier) {
        uVar6 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start[2];
        goto LAB_005f34af;
      }
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      local_230 = spvOpcodeString(OpMemoryNamedBarrier);
      pDVar10 = DiagnosticStream::operator<<(&local_208,&local_230);
      pcVar12 = ": expected Named Barrier to be of type OpTypeNamedBarrier";
      lVar11 = 0x39;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar10,pcVar12,lVar11);
    sVar5 = pDVar10->error_;
    DiagnosticStream::~DiagnosticStream(&local_208);
  }
  return sVar5;
}

Assistant:

spv_result_t BarriersPass(ValidationState_t& _, const Instruction* inst) {
  const spv::Op opcode = inst->opcode();
  const uint32_t result_type = inst->type_id();

  switch (opcode) {
    case spv::Op::OpControlBarrier: {
      if (_.version() < SPV_SPIRV_VERSION_WORD(1, 3)) {
        _.function(inst->function()->id())
            ->RegisterExecutionModelLimitation(
                [](spv::ExecutionModel model, std::string* message) {
                  if (model != spv::ExecutionModel::TessellationControl &&
                      model != spv::ExecutionModel::GLCompute &&
                      model != spv::ExecutionModel::Kernel &&
                      model != spv::ExecutionModel::TaskNV &&
                      model != spv::ExecutionModel::MeshNV) {
                    if (message) {
                      *message =
                          "OpControlBarrier requires one of the following "
                          "Execution "
                          "Models: TessellationControl, GLCompute, Kernel, "
                          "MeshNV or TaskNV";
                    }
                    return false;
                  }
                  return true;
                });
      }

      const uint32_t execution_scope = inst->word(1);
      const uint32_t memory_scope = inst->word(2);

      if (auto error = ValidateExecutionScope(_, inst, execution_scope)) {
        return error;
      }

      if (auto error = ValidateMemoryScope(_, inst, memory_scope)) {
        return error;
      }

      if (auto error = ValidateMemorySemantics(_, inst, 2, memory_scope)) {
        return error;
      }
      break;
    }

    case spv::Op::OpMemoryBarrier: {
      const uint32_t memory_scope = inst->word(1);

      if (auto error = ValidateMemoryScope(_, inst, memory_scope)) {
        return error;
      }

      if (auto error = ValidateMemorySemantics(_, inst, 1, memory_scope)) {
        return error;
      }
      break;
    }

    case spv::Op::OpNamedBarrierInitialize: {
      if (_.GetIdOpcode(result_type) != spv::Op::OpTypeNamedBarrier) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << spvOpcodeString(opcode)
               << ": expected Result Type to be OpTypeNamedBarrier";
      }

      const uint32_t subgroup_count_type = _.GetOperandTypeId(inst, 2);
      if (!_.IsIntScalarType(subgroup_count_type) ||
          _.GetBitWidth(subgroup_count_type) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << spvOpcodeString(opcode)
               << ": expected Subgroup Count to be a 32-bit int";
      }
      break;
    }

    case spv::Op::OpMemoryNamedBarrier: {
      const uint32_t named_barrier_type = _.GetOperandTypeId(inst, 0);
      if (_.GetIdOpcode(named_barrier_type) != spv::Op::OpTypeNamedBarrier) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << spvOpcodeString(opcode)
               << ": expected Named Barrier to be of type OpTypeNamedBarrier";
      }

      const uint32_t memory_scope = inst->word(2);

      if (auto error = ValidateMemoryScope(_, inst, memory_scope)) {
        return error;
      }

      if (auto error = ValidateMemorySemantics(_, inst, 2, memory_scope)) {
        return error;
      }
      break;
    }

    default:
      break;
  }

  return SPV_SUCCESS;
}